

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_CfdAddPegoutTest_Test::TestBody
          (cfdcapi_elements_transaction_CfdAddPegoutTest_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  long *expected_predicate_value;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  char *str_buffer;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  char *addr;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  void *err_handle;
  AssertionResult gtest_ar_6;
  char *in_stack_00000370;
  AssertionResult gtest_ar_5;
  int64_t in_stack_00000388;
  void *in_stack_00000390;
  void *in_stack_00000398;
  AssertionResult gtest_ar_4;
  char *mainchain_address;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  int64_t in_stack_00000450;
  char *in_stack_00000458;
  void *in_stack_00000460;
  AssertionResult gtest_ar_1;
  void *create_handle;
  int64_t satoshi;
  char *tx_string;
  char *in_stack_00000490;
  char *in_stack_00000498;
  uint32_t in_stack_000004a0;
  char *in_stack_000004a8;
  char **in_stack_000004b0;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  char *in_stack_fffffffffffffad8;
  AssertionResult *in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffae8;
  char *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  void *in_stack_fffffffffffffb18;
  AssertionResult *pAVar4;
  char **in_stack_fffffffffffffb70;
  AssertionResult *in_stack_fffffffffffffb78;
  uint32_t in_stack_fffffffffffffbcc;
  char *in_stack_fffffffffffffbd0;
  AssertionResult *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffca8;
  AssertHelper in_stack_fffffffffffffcb0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcb8;
  AssertionResult local_338;
  AssertHelper local_328;
  Message local_320;
  AssertionResult local_318;
  AssertHelper local_308;
  Message local_300;
  undefined4 local_2f4;
  AssertionResult local_2f0;
  char *local_2e0;
  AssertHelper local_2d8;
  Message local_2d0;
  AssertionResult local_2c8;
  AssertHelper local_2b8;
  Message local_2b0;
  undefined4 local_2a4;
  AssertionResult local_2a0;
  AssertHelper local_290;
  Message local_288;
  AssertionResult local_280;
  AssertHelper local_270;
  Message local_268;
  undefined4 local_25c;
  AssertionResult local_258;
  char *local_248;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  undefined4 local_204;
  char **in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe08;
  uint32_t in_stack_fffffffffffffe0c;
  void *in_stack_fffffffffffffe10;
  AssertHelper in_stack_fffffffffffffe18;
  Message local_1e0;
  undefined4 local_1d4;
  AssertionResult local_1d0;
  AssertHelper local_1c0;
  Message local_1b8;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198;
  undefined4 local_18c;
  AssertionResult local_188;
  char *local_178;
  AssertHelper local_170;
  Message local_168;
  undefined4 local_15c;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140;
  undefined4 local_134;
  AssertionResult local_130;
  string local_120;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_e9;
  AssertionResult local_e8;
  AssertHelper local_d8;
  Message local_d0;
  undefined4 local_c4;
  AssertionResult local_c0;
  long local_b0 [2];
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  internal local_60 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  AssertHelper in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffbc;
  uint32_t in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8))
  ;
  pAVar4 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
             in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
             (int *)in_stack_fffffffffffffae0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36b51a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x7f2,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    testing::Message::~Message((Message *)0x36b57d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36b5d2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffae0,(bool *)in_stack_fffffffffffffad8,(type *)0x36b606);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,local_60,(AssertionResult *)"(NULL == handle)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x7f3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x36b702);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36b77d);
  local_a0 = (char *)0x0;
  local_b0[0] = 0;
  expected_predicate_value = local_b0;
  local_14 = CfdInitializeTransaction
                       (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                        in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                        (char *)in_stack_ffffffffffffffb0.data_,
                        (void **)in_stack_ffffffffffffffa8.ptr_);
  local_c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
             in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
             (int *)in_stack_fffffffffffffae0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar2) {
    testing::Message::Message(&local_d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36b86d);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x7fa,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message((Message *)0x36b8d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36b925);
  local_e9 = local_b0[0] != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffae0,(bool *)in_stack_fffffffffffffad8,(type *)0x36b959);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar2) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_e8,(AssertionResult *)"(NULL == create_handle)","true",
               "false",(char *)expected_predicate_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x7fb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    testing::Message::~Message((Message *)0x36ba55);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36bad0);
  if (local_14 == 0) {
    local_14 = CfdAddTransactionInput
                         (in_stack_fffffffffffffcb8.ptr_,in_stack_fffffffffffffcb0.data_,
                          (char *)CONCAT17(uVar1,in_stack_fffffffffffffca8),
                          (uint32_t)((ulong)pAVar4 >> 0x20),(uint32_t)pAVar4);
    local_134 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
               (int *)in_stack_fffffffffffffae0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_130);
    if (!bVar2) {
      testing::Message::Message(&local_140);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36bbb6);
      testing::internal::AssertHelper::AssertHelper
                (&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x800,pcVar3);
      testing::internal::AssertHelper::operator=(&local_148,&local_140);
      testing::internal::AssertHelper::~AssertHelper(&local_148);
      testing::Message::~Message((Message *)0x36bc19);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36bc6e);
  }
  if (local_14 == 0) {
    local_b0[1] = 0xbefe33cc397c;
    local_14 = CfdAddTransactionOutput
                         (in_stack_00000398,in_stack_00000390,in_stack_00000388,
                          (char *)gtest_ar_5.message_.ptr_,(char *)gtest_ar_5._0_8_,
                          in_stack_00000370);
    local_15c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
               (int *)in_stack_fffffffffffffae0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_158);
    if (!bVar2) {
      testing::Message::Message(&local_168);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36bd76);
      testing::internal::AssertHelper::AssertHelper
                (&local_170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x809,pcVar3);
      testing::internal::AssertHelper::operator=(&local_170,&local_168);
      testing::internal::AssertHelper::~AssertHelper(&local_170);
      testing::Message::~Message((Message *)0x36bdd9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36be2e);
  }
  if (local_14 == 0) {
    local_b0[1] = 1000000000;
    local_178 = (char *)0x0;
    in_stack_fffffffffffffaf0 =
         "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))"
    ;
    in_stack_fffffffffffffae8 = "cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL";
    in_stack_fffffffffffffae0 = (AssertionResult *)0x80565c;
    in_stack_fffffffffffffad8 = "0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206";
    in_stack_fffffffffffffaf8 = 0;
    local_14 = CfdAddTxPegoutOutput
                         ((void *)gtest_ar_1._0_8_,in_stack_00000460,in_stack_00000458,
                          in_stack_00000450,gtest_ar__1.message_.ptr_._4_4_,
                          (int)gtest_ar__1.message_.ptr_,(char *)satoshi,tx_string,in_stack_00000490
                          ,in_stack_00000498,in_stack_000004a0,in_stack_000004a8,in_stack_000004b0);
    local_18c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
               (int *)in_stack_fffffffffffffae0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar2) {
      testing::Message::Message(&local_198);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36bf86);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x819,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      testing::Message::~Message((Message *)0x36bfe9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36c03e);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1b0,"\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"",
                 "mainchain_address","2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",local_178);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
      if (!bVar2) {
        testing::Message::Message(&local_1b8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36c0ed);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x81b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        testing::Message::~Message((Message *)0x36c150);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36c1a5);
      CfdFreeStringBuffer(in_stack_fffffffffffffae8);
    }
  }
  if (local_14 == 0) {
    local_b0[1] = 0x1c84;
    local_14 = CfdAddTransactionOutput
                         (in_stack_00000398,in_stack_00000390,in_stack_00000388,
                          (char *)gtest_ar_5.message_.ptr_,(char *)gtest_ar_5._0_8_,
                          in_stack_00000370);
    local_1d4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
               (int *)in_stack_fffffffffffffae0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
    if (!bVar2) {
      testing::Message::Message(&local_1e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36c2b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x826,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe18,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe18);
      testing::Message::~Message((Message *)0x36c313);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36c368);
  }
  if (local_14 == 0) {
    in_stack_fffffffffffffe10 = (void *)0x0;
    local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8
                                                ));
    if (local_14 == 0) {
      local_14 = CfdHasPegoutConfidentialTxOut
                           (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                            in_stack_fffffffffffffbcc);
      local_204 = 8;
      in_stack_fffffffffffffbd8 = (AssertionResult *)&stack0xfffffffffffffe00;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                 in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
                 (int *)in_stack_fffffffffffffae0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffbd8);
      if (!bVar2) {
        testing::Message::Message(&local_210);
        in_stack_fffffffffffffbd0 =
             testing::AssertionResult::failure_message((AssertionResult *)0x36c471);
        testing::internal::AssertHelper::AssertHelper
                  (&local_218,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x82e,in_stack_fffffffffffffbd0);
        testing::internal::AssertHelper::operator=(&local_218,&local_210);
        testing::internal::AssertHelper::~AssertHelper(&local_218);
        testing::Message::~Message((Message *)0x36c4d4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36c529);
      CfdFreeHandle(in_stack_fffffffffffffae8);
    }
    local_14 = CfdHasPegoutConfidentialTxOut
                         (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                          in_stack_fffffffffffffbcc);
    local_22c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
               (int *)in_stack_fffffffffffffae0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar2) {
      testing::Message::Message(&local_238);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36c606);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x833,pcVar3);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x36c669);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36c6be);
  }
  if (local_14 == 0) {
    local_248 = (char *)0x0;
    local_14 = CfdGetPegoutMainchainAddress
                         (in_stack_fffffffffffffe18.data_,in_stack_fffffffffffffe10,
                          in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
                          in_stack_fffffffffffffe00);
    local_25c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
               (int *)in_stack_fffffffffffffae0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar2) {
      testing::Message::Message(&local_268);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36c7b5);
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x83a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_270,&local_268);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      testing::Message::~Message((Message *)0x36c818);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36c86d);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_280,"\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"","addr",
                 "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",local_248);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_280);
      if (!bVar2) {
        testing::Message::Message(&local_288);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36c91c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_290,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x83c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_290,&local_288);
        testing::internal::AssertHelper::~AssertHelper(&local_290);
        testing::Message::~Message((Message *)0x36c97f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36c9d4);
      CfdFreeStringBuffer(in_stack_fffffffffffffae8);
    }
  }
  if (local_14 == 0) {
    local_14 = CfdFinalizeTransaction
                         (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,(char **)0x36ca22);
    local_2a4 = 0;
    in_stack_fffffffffffffb78 = &local_2a0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
               (int *)in_stack_fffffffffffffae0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffb78);
    if (!bVar2) {
      testing::Message::Message(&local_2b0);
      in_stack_fffffffffffffb70 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x36cac4);
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x843,(char *)in_stack_fffffffffffffb70);
      testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
      testing::internal::AssertHelper::~AssertHelper(&local_2b8);
      testing::Message::~Message((Message *)0x36cb27);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36cb7c);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_2c8,
                 "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
                 ,"tx_string",
                 "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
                 ,local_a0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
      if (!bVar2) {
        testing::Message::Message(&local_2d0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36cc2b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x845,pcVar3);
        testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
        testing::internal::AssertHelper::~AssertHelper(&local_2d8);
        testing::Message::~Message((Message *)0x36cc8e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x36cce3);
      CfdFreeStringBuffer(in_stack_fffffffffffffae8);
    }
  }
  CfdFreeTransactionHandle(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffb18);
  if (local_14 != 0) {
    local_2e0 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    local_2f4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
               (int *)in_stack_fffffffffffffae0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
    if (!bVar2) {
      testing::Message::Message(&local_300);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36cdf4);
      testing::internal::AssertHelper::AssertHelper
                (&local_308,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x850,pcVar3);
      testing::internal::AssertHelper::operator=(&local_308,&local_300);
      testing::internal::AssertHelper::~AssertHelper(&local_308);
      testing::Message::~Message((Message *)0x36ce51);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36cea6);
    testing::internal::CmpHelperSTREQ((internal *)&local_318,"\"\"","str_buffer","",local_2e0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_318);
    if (!bVar2) {
      testing::Message::Message(&local_320);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36cf3b);
      testing::internal::AssertHelper::AssertHelper
                (&local_328,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x851,pcVar3);
      testing::internal::AssertHelper::operator=(&local_328,&local_320);
      testing::internal::AssertHelper::~AssertHelper(&local_328);
      testing::Message::~Message((Message *)0x36cf98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x36cfed);
    CfdFreeStringBuffer(in_stack_fffffffffffffae8);
    local_2e0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffae8);
  pAVar4 = &local_338;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
             in_stack_fffffffffffffaf0,(CfdErrorCode *)in_stack_fffffffffffffae8,
             (int *)in_stack_fffffffffffffae0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar2) {
    testing::Message::Message((Message *)&stack0xfffffffffffffcb8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x36d0bd);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffcb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x857,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffcb0,(Message *)&stack0xfffffffffffffcb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffcb0);
    testing::Message::~Message((Message *)0x36d11a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x36d16f);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CfdAddPegoutTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  int64_t satoshi;

  void* create_handle = nullptr;
  ret = CfdInitializeTransaction(handle, kCfdNetworkLiquidv1, 2, 0, nullptr, &create_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == create_handle));
  if (ret == kCfdSuccess) {
    ret = CfdAddTransactionInput(
      handle, create_handle, "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3", 0,
      4294967293U);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 209998999992700;
    ret = CfdAddTransactionOutput(
      handle, create_handle, satoshi,
      "XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", "",
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    satoshi = 1000000000;
    char* mainchain_address = nullptr;
    ret = CfdAddTxPegoutOutput(
      handle, create_handle,
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225", satoshi,
      kCfdNetworkRegtest, kCfdNetworkElementsRegtest,
      "0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",
      "0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d",
      "cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
      0, "030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d",
      &mainchain_address);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo", mainchain_address);
      CfdFreeStringBuffer(mainchain_address);
    }
  }

  if (ret == kCfdSuccess) {
    satoshi = 7300;
    ret = CfdAddTransactionOutput(
      handle, create_handle, satoshi,
      nullptr, nullptr,
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    void* err_handle = NULL;
    ret = CfdCreateHandle(&err_handle);
    if (ret == kCfdSuccess) {
      ret = CfdHasPegoutConfidentialTxOut(err_handle, create_handle, 0);
      EXPECT_EQ(kCfdNotFoundError, ret);
      CfdFreeHandle(err_handle);
    }

    ret = CfdHasPegoutConfidentialTxOut(handle, create_handle, 1);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  if (ret == kCfdSuccess) {
    char* addr = nullptr;
    ret = CfdGetPegoutMainchainAddress(
      handle, create_handle, 1, kCfdNetworkRegtest, &addr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo", addr);
      CfdFreeStringBuffer(addr);
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdFinalizeTransaction(handle, create_handle, &tx_string);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000", tx_string);
      CfdFreeStringBuffer(tx_string);
    }
  }

  CfdFreeTransactionHandle(handle, create_handle);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}